

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fTextureSpecificationTests.cpp
# Opt level: O2

void __thiscall
deqp::gles2::Functional::TexSubImage2DEmptyTexCase::createTexture(TexSubImage2DEmptyTexCase *this)

{
  ContextWrapper *this_00;
  uint uVar1;
  deUint32 type;
  uint uVar2;
  deUint32 dVar3;
  uint uVar4;
  int ndx;
  int iVar5;
  int iVar6;
  int iVar7;
  int height;
  deUint32 tex;
  int local_e0;
  int local_dc;
  TexSubImage2DEmptyTexCase *local_d8;
  ContextWrapper *local_d0;
  TextureFormat fmt;
  Vec4 gMax;
  Vec4 gMin;
  Random rnd;
  TextureLevel data;
  Vector<float,_4> local_68;
  PixelBufferAccess local_58;
  
  fmt = (this->super_TextureSpecCase).m_texFormat;
  if (((this->super_TextureSpecCase).m_flags & 1) == 0) {
    iVar6 = 1;
  }
  else {
    uVar1 = (this->super_TextureSpecCase).m_width;
    uVar2 = 0x20;
    uVar4 = uVar2;
    if (uVar1 != 0) {
      uVar4 = 0x1f;
      if (uVar1 != 0) {
        for (; uVar1 >> uVar4 == 0; uVar4 = uVar4 - 1) {
        }
      }
      uVar4 = uVar4 ^ 0x1f;
    }
    uVar1 = (this->super_TextureSpecCase).m_height;
    if (uVar1 != 0) {
      uVar2 = 0x1f;
      if (uVar1 != 0) {
        for (; uVar1 >> uVar2 == 0; uVar2 = uVar2 - 1) {
        }
      }
      uVar2 = uVar2 ^ 0x1f;
    }
    iVar6 = 0x1f - uVar2;
    if ((int)(0x1f - uVar2) < (int)(0x1f - uVar4)) {
      iVar6 = 0x1f - uVar4;
    }
    iVar6 = iVar6 + 1;
  }
  tex = 0;
  tcu::TextureLevel::TextureLevel(&data,&fmt);
  dVar3 = deStringHash((this->super_TextureSpecCase).super_TestCase.super_TestCase.super_TestNode.
                       m_name._M_dataplus._M_p);
  deRandom_init(&rnd.m_rnd,dVar3);
  this_00 = &(this->super_TextureSpecCase).super_ContextWrapper;
  sglr::ContextWrapper::glGenTextures(this_00,1,&tex);
  sglr::ContextWrapper::glBindTexture(this_00,0xde1,tex);
  sglr::ContextWrapper::glPixelStorei(this_00,0xcf5,1);
  for (iVar5 = 0; iVar6 != iVar5; iVar5 = iVar5 + 1) {
    iVar7 = (this->super_TextureSpecCase).m_width >> ((byte)iVar5 & 0x1f);
    if (iVar7 < 2) {
      iVar7 = 1;
    }
    height = (this->super_TextureSpecCase).m_height >> ((byte)iVar5 & 0x1f);
    if (height < 2) {
      height = 1;
    }
    sglr::ContextWrapper::glTexImage2D
              (this_00,0xde1,iVar5,this->m_format,iVar7,height,0,this->m_format,this->m_dataType,
               (void *)0x0);
  }
  local_e0 = iVar6;
  local_d8 = this;
  local_d0 = this_00;
  for (iVar5 = 0; local_e0 != iVar5; iVar5 = iVar5 + 1) {
    iVar6 = (local_d8->super_TextureSpecCase).m_width >> ((byte)iVar5 & 0x1f);
    if (iVar6 < 2) {
      iVar6 = 1;
    }
    iVar7 = (local_d8->super_TextureSpecCase).m_height >> ((byte)iVar5 & 0x1f);
    if (iVar7 < 2) {
      iVar7 = 1;
    }
    local_dc = iVar5;
    tcu::Vector<float,_4>::Vector((Vector<float,_4> *)&local_58,0.0);
    tcu::Vector<float,_4>::Vector((Vector<float,_4> *)&gMax,1.0);
    randomVector<4>((Functional *)&gMin,&rnd,(Vector<float,_4> *)&local_58,(Vector<float,_4> *)&gMax
                   );
    tcu::Vector<float,_4>::Vector((Vector<float,_4> *)&local_58,0.0);
    tcu::Vector<float,_4>::Vector(&local_68,1.0);
    randomVector<4>((Functional *)&gMax,&rnd,(Vector<float,_4> *)&local_58,&local_68);
    tcu::TextureLevel::setSize(&data,iVar6,iVar7,1);
    tcu::TextureLevel::getAccess(&local_58,&data);
    tcu::fillWithComponentGradients(&local_58,&gMin,&gMax);
    dVar3 = local_d8->m_format;
    type = local_d8->m_dataType;
    tcu::TextureLevel::getAccess(&local_58,&data);
    iVar5 = local_dc;
    sglr::ContextWrapper::glTexSubImage2D
              (local_d0,0xde1,local_dc,0,0,iVar6,iVar7,dVar3,type,
               local_58.super_ConstPixelBufferAccess.m_data);
  }
  tcu::TextureLevel::~TextureLevel(&data);
  return;
}

Assistant:

void createTexture (void)
	{
		tcu::TextureFormat	fmt			= m_texFormat;
		int					numLevels	= (m_flags & MIPMAPS) ? de::max(deLog2Floor32(m_width), deLog2Floor32(m_height))+1 : 1;
		deUint32			tex			= 0;
		tcu::TextureLevel	data		(fmt);
		de::Random			rnd			(deStringHash(getName()));

		glGenTextures(1, &tex);
		glBindTexture(GL_TEXTURE_2D, tex);
		glPixelStorei(GL_UNPACK_ALIGNMENT, 1);

		// First allocate storage for each level.
		for (int ndx = 0; ndx < numLevels; ndx++)
		{
			int		levelW		= de::max(1, m_width >> ndx);
			int		levelH		= de::max(1, m_height >> ndx);

			glTexImage2D(GL_TEXTURE_2D, ndx, m_format, levelW, levelH, 0, m_format, m_dataType, DE_NULL);
		}

		// Specify pixel data to all levels using glTexSubImage2D()
		for (int ndx = 0; ndx < numLevels; ndx++)
		{
			int		levelW		= de::max(1, m_width >> ndx);
			int		levelH		= de::max(1, m_height >> ndx);
			Vec4	gMin		= randomVector<4>(rnd);
			Vec4	gMax		= randomVector<4>(rnd);

			data.setSize(levelW, levelH);
			tcu::fillWithComponentGradients(data.getAccess(), gMin, gMax);

			glTexSubImage2D(GL_TEXTURE_2D, ndx, 0, 0, levelW, levelH, m_format, m_dataType, data.getAccess().getDataPtr());
		}
	}